

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O1

void __thiscall
Buffer_make_contiguous_fires_no_change_events_Test::TestBody
          (Buffer_make_contiguous_fires_no_change_events_Test *this)

{
  void *pvVar1;
  pointer *__ptr;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  BufferWithReadonlyStrings local;
  AssertHelper local_110;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  AssertHelper local_f8;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  BufferWithReadonlyStrings local_d0;
  
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_d0);
  bfy_buffer_set_changed_cb
            (&local_d0.buf,
             (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
             {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
             &local_d0.changes);
  pvVar1 = bfy_buffer_make_all_contiguous(&local_d0.buf);
  local_108._M_head_impl._0_1_ = pvVar1 != (void *)0x0;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pvVar1 == (void *)0x0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,(internal *)&local_108,
               (AssertionResult *)"bfy_buffer_make_all_contiguous(&local.buf)","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x52f,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f0._1_7_,local_f0[0]) != &local_e0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f0._1_7_,local_f0[0]),local_e0._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_110.data_._0_4_ = 0;
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)local_d0.changes.
               super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)local_d0.changes.
               super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_f0,"0","std::size(local.changes)",(int *)&local_110,
             (unsigned_long *)&local_108);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x530,message);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_d0);
  return;
}

Assistant:

TEST(Buffer, make_contiguous_fires_no_change_events) {
    BufferWithReadonlyStrings local;

    local.start_listening_to_changes();
    EXPECT_TRUE(bfy_buffer_make_all_contiguous(&local.buf));
    EXPECT_EQ(0, std::size(local.changes));
}